

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
DescriptorCache::GetCachedDerivedExtPubKey
          (DescriptorCache *this,uint32_t key_exp_pos,uint32_t der_index,CExtPubKey *xpub)

{
  bool bVar1;
  pointer pvVar2;
  void *in_RCX;
  _Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *in_RDI;
  long in_FS_OFFSET;
  const_iterator *der_it;
  const_iterator *key_exp_it;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
  *in_stack_ffffffffffffff90;
  unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
  *this_00;
  bool local_31;
  _Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
  local_20;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
  local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
       ::find((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
               *)in_stack_ffffffffffffff90,
              (key_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
       ::end((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
              *)in_stack_ffffffffffffff90);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
                      *)in_RDI,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
                      *)in_stack_ffffffffffffff90);
  if (bVar1) {
    local_31 = false;
  }
  else {
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
    ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
                  *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
         ::find(in_stack_ffffffffffffff90,
                (key_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    this_00 = (unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
               *)&stack0xffffffffffffffd8;
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
    ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
                  *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::
    unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
    ::end(this_00);
    bVar1 = std::__detail::operator==
                      (in_RDI,(_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                               *)this_00);
    if (bVar1) {
      local_31 = false;
    }
    else {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
                           *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      memcpy(in_RCX,&pvVar2->second,0x71);
      local_31 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorCache::GetCachedDerivedExtPubKey(uint32_t key_exp_pos, uint32_t der_index, CExtPubKey& xpub) const
{
    const auto& key_exp_it = m_derived_xpubs.find(key_exp_pos);
    if (key_exp_it == m_derived_xpubs.end()) return false;
    const auto& der_it = key_exp_it->second.find(der_index);
    if (der_it == key_exp_it->second.end()) return false;
    xpub = der_it->second;
    return true;
}